

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
IsObjTypeSpecEquivalentImpl<false>
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this,Type *type,
          EquivalentPropertyEntry *entry)

{
  int iVar1;
  bool bVar2;
  uint16 uVar3;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  SimpleDictionaryPropertyDescriptor<int> *local_48;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext;
  PropertyIndex relSlotIndex;
  EquivalentPropertyEntry *pEStack_28;
  int absSlotIndex;
  EquivalentPropertyEntry *entry_local;
  Type *type_local;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this_local;
  
  scriptContext._4_4_ = 0xffff;
  scriptContext._2_2_ = 0xffff;
  pEStack_28 = entry;
  entry_local = (EquivalentPropertyEntry *)type;
  type_local = (Type *)this;
  propertyRecord = (PropertyRecord *)Js::Type::GetScriptContext(type);
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)
               ScriptContext::GetPropertyName
                         ((ScriptContext *)propertyRecord,pEStack_28->propertyId);
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,(PropertyRecord **)&descriptor,&local_48);
  if (((bVar2) && ((local_48->Attributes & 8) == 0)) &&
     (scriptContext._4_4_ = local_48->propertyIndex, scriptContext._4_4_ < 0xffff)) {
    scriptContext._2_2_ =
         DynamicTypeHandler::AdjustValidSlotIndexForInlineSlots
                   (&this->super_DynamicTypeHandler,(PropertyIndex)scriptContext._4_4_);
  }
  iVar1 = scriptContext._4_4_;
  if (scriptContext._2_2_ == 0xffff) {
    if ((pEStack_28->slotIndex != 0xffff) || ((pEStack_28->mustBeWritable & 1U) != 0)) {
      return false;
    }
  }
  else {
    if ((scriptContext._2_2_ != pEStack_28->slotIndex) ||
       (uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler),
       (int)(uint)uVar3 <= iVar1 != (bool)(pEStack_28->isAuxSlot & 1U))) {
      return false;
    }
    if (((pEStack_28->mustBeWritable & 1U) != 0) &&
       (((local_48->Attributes & 4) == 0 ||
        (bVar2 = SimpleDictionaryPropertyDescriptor<int>::IsOrMayBecomeFixed(local_48), bVar2)))) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::IsObjTypeSpecEquivalentImpl(const Type* type, const EquivalentPropertyEntry *entry)
    {
        TPropertyIndex absSlotIndex = Constants::NoSlot;
        PropertyIndex relSlotIndex = Constants::NoSlot;

        ScriptContext* scriptContext = type->GetScriptContext();

        const PropertyRecord* propertyRecord =
            doLock ? scriptContext->GetPropertyNameLocked(entry->propertyId) : scriptContext->GetPropertyName(entry->propertyId);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (this->propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            absSlotIndex = descriptor->propertyIndex;
            if (absSlotIndex <= Constants::PropertyIndexMax)
            {
                relSlotIndex = AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(absSlotIndex));
            }
        }

        if (relSlotIndex != Constants::NoSlot)
        {
            if (relSlotIndex != entry->slotIndex || ((absSlotIndex >= GetInlineSlotCapacity()) != entry->isAuxSlot))
            {
                return false;
            }

            if (entry->mustBeWritable && (!(descriptor->Attributes & PropertyWritable) || descriptor->IsOrMayBecomeFixed()))
            {
                return false;
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }